

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void copy2buff(StkId top,int n,char *buff)

{
  size_t local_38;
  size_t l;
  size_t tl;
  char *buff_local;
  int n_local;
  StkId top_local;
  
  l = 0;
  buff_local._4_4_ = n;
  while( true ) {
    if ((top[-(long)buff_local._4_4_].tt_ & 0xf) != 4) {
      __assert_fail("(((((((top - n))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x31a,"void copy2buff(StkId, int, char *)");
    }
    if (((top[-(long)buff_local._4_4_].value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((top - n)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x31a,"void copy2buff(StkId, int, char *)");
    }
    if ((top[-(long)buff_local._4_4_].value_.gc)->tt == '\x04') {
      if ((top[-(long)buff_local._4_4_].tt_ & 0xf) != 4) {
        __assert_fail("(((((((top - n))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x31a,"void copy2buff(StkId, int, char *)");
      }
      if (((top[-(long)buff_local._4_4_].value_.gc)->tt & 0xf) != 4) {
        __assert_fail("(((((top - n)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x31a,"void copy2buff(StkId, int, char *)");
      }
      local_38 = (size_t)(byte)top[-(long)buff_local._4_4_].value_.f[0xb];
    }
    else {
      if ((top[-(long)buff_local._4_4_].tt_ & 0xf) != 4) {
        __assert_fail("(((((((top - n))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x31a,"void copy2buff(StkId, int, char *)");
      }
      if (((top[-(long)buff_local._4_4_].value_.gc)->tt & 0xf) != 4) {
        __assert_fail("(((((top - n)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x31a,"void copy2buff(StkId, int, char *)");
      }
      local_38 = *(size_t *)(top[-(long)buff_local._4_4_].value_.f + 0x10);
    }
    if ((top[-(long)buff_local._4_4_].tt_ & 0xf) != 4) {
      __assert_fail("(((((((top - n))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x31b,"void copy2buff(StkId, int, char *)");
    }
    if (((top[-(long)buff_local._4_4_].value_.gc)->tt & 0xf) != 4) break;
    memcpy(buff + l,top[-(long)buff_local._4_4_].value_.f + 0x18,local_38);
    l = local_38 + l;
    buff_local._4_4_ = buff_local._4_4_ + -1;
    if (buff_local._4_4_ < 1) {
      return;
    }
  }
  __assert_fail("(((((top - n)->value_).gc)->tt) & 0x0F) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0x31b,"void copy2buff(StkId, int, char *)");
}

Assistant:

static void copy2buff (StkId top, int n, char *buff) {
  size_t tl = 0;  /* size already copied */
  do {
    size_t l = vslen(top - n);  /* length of string being copied */
    memcpy(buff + tl, svalue(top - n), l * sizeof(char));
    tl += l;
  } while (--n > 0);
}